

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::ByteArray::Squeeze(ByteArray *this)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  _Vector_base<char,_std::allocator<char>_> local_28;
  
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_28,&this->m_data);
  pcVar2 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar1 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_28._M_impl.super__Vector_impl_data._M_start;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_28._M_impl.super__Vector_impl_data._M_finish;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_28._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28._M_impl.super__Vector_impl_data._M_start = pcVar2;
  local_28._M_impl.super__Vector_impl_data._M_finish = pcVar3;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = pcVar1;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void ByteArray::Squeeze()
{
    std::vector<char> t(m_data);
    t.swap(m_data);
}